

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

void __thiscall ACSStringPool::Dump(ACSStringPool *this)

{
  PoolEntry *pPVar1;
  long lVar2;
  uint i;
  ulong uVar3;
  
  lVar2 = 0x10;
  for (uVar3 = 0; uVar3 < (this->Pool).Count; uVar3 = uVar3 + 1) {
    pPVar1 = (this->Pool).Array;
    if (*(int *)((long)pPVar1 + lVar2 + -4) != -2) {
      Printf("%4u. (%2d) \"%s\"\n",uVar3 & 0xffffffff,
             (ulong)*(uint *)((long)&(pPVar1->Str).Chars + lVar2),
             *(undefined8 *)((long)pPVar1 + lVar2 + -0x10));
    }
    lVar2 = lVar2 + 0x18;
  }
  Printf("First free %u\n",(ulong)this->FirstFreeEntry);
  return;
}

Assistant:

void ACSStringPool::Dump() const
{
	for (unsigned int i = 0; i < Pool.Size(); ++i)
	{
		if (Pool[i].Next != FREE_ENTRY)
		{
			Printf("%4u. (%2d) \"%s\"\n", i, Pool[i].LockCount, Pool[i].Str.GetChars());
		}
	}
	Printf("First free %u\n", FirstFreeEntry);
}